

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SPPMIntegrator::SampleLd
          (SPPMIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,LightSamplerHandle *lightSampler)

{
  Vector3f *pVVar1;
  anon_struct_60_5_be74bf41_for_shading *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar14;
  undefined4 uVar15;
  ulong uVar11;
  pointer pLVar12;
  undefined4 uVar16;
  size_t sVar13;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  short sVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  LightSampleContext LVar25;
  LightSampleContext LVar26;
  LightSampleContext LVar27;
  LightSampleContext LVar28;
  Vector3f VVar29;
  Vector3f VVar30;
  Vector3f wiRender;
  Vector3f VVar31;
  Vector3f VVar32;
  Vector3f wiRender_00;
  undefined1 auVar33 [32];
  undefined1 auVar34 [24];
  undefined1 auVar35 [32];
  undefined1 auVar36 [24];
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  Point3fi *pPVar42;
  Point3fi *pPVar43;
  undefined8 uVar44;
  SPPMIntegrator *pSVar45;
  Interval<float> IVar46;
  undefined1 wiRender_01 [12];
  bool bVar47;
  int iVar48;
  int iVar49;
  ulong uVar50;
  uint uVar51;
  ExhaustiveLightSampler *pEVar52;
  HaltonSampler *pHVar53;
  ImageInfiniteLight *this_00;
  DebugMLTSampler *pDVar54;
  pointer pLVar55;
  BSDF *pBVar56;
  long in_FS_OFFSET;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar63 [48];
  undefined1 auVar60 [64];
  undefined1 auVar62 [64];
  Float f_1;
  Float FVar64;
  undefined1 auVar67 [16];
  float fVar66;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar79 [64];
  float fVar65;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar88 [64];
  undefined1 auVar68 [16];
  undefined1 auVar89 [64];
  undefined1 auVar69 [16];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar70 [16];
  undefined1 auVar90 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar94 [64];
  undefined1 auVar71 [16];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar95 [64];
  undefined4 uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar106 [56];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 in_ZMM5 [64];
  Vector3f woRender;
  Vector3f woRender_00;
  SampledSpectrum SVar107;
  Vector3f wiRender_02;
  SampledSpectrum f;
  Vector3f wi;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum Le;
  BSDFSample bs;
  Ray ray;
  optional<pbrt::ShapeIntersection> si;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  DispatchSplit<5> local_379;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [12];
  float fStack_35c;
  Interval<float> IStack_358;
  long lStack_350;
  float fStack_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  float local_33c;
  SampledWavelengths *local_330;
  BSDF *local_328;
  Tuple3<pbrt::Normal3,_float> *local_320;
  Vector3f local_318;
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [4];
  undefined1 auStack_2c4 [8];
  float fStack_2bc;
  float local_2b8;
  undefined4 local_2b4;
  Vector3f *local_2b0;
  ulong *puStack_2a8;
  ulong *local_2a0;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  float local_280;
  float local_27c;
  undefined1 local_278;
  Interval<float> local_268;
  Interval<float> IStack_260;
  undefined1 local_258 [32];
  float local_238;
  Tuple3<pbrt::Normal3,_float> local_234;
  Interval<float> local_228;
  Interval<float> IStack_220;
  Interval<float> IStack_218;
  long lStack_210;
  float local_208;
  undefined4 local_204;
  undefined4 uStack_200;
  float local_1fc;
  LightSamplerHandle *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  float local_1e0;
  Interval<float> local_1d8;
  Interval<float> IStack_1d0;
  Interval<float> IStack_1c8;
  long lStack_1c0;
  float fStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  float fStack_1ac;
  Float local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  Interval<float> local_198;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  Float FStack_180;
  undefined4 uStack_17c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_178;
  Interval<float> local_168;
  Interval<float> IStack_160;
  Interval<float> IStack_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  undefined1 local_138 [4];
  float afStack_134 [3];
  Interval<float> IStack_128;
  undefined8 uStack_120;
  float fStack_118;
  undefined1 auStack_114 [8];
  float fStack_10c;
  undefined1 auStack_108 [16];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined8 local_38;
  undefined1 auVar59 [64];
  undefined1 auVar61 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 auVar96 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 auVar101 [64];
  
  auVar79 = _local_138;
  auVar63 = in_ZmmResult._16_48_;
  auVar58 = in_ZMM1._0_16_;
  IStack_128 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  auVar75 = _local_138;
  pPVar42 = &(intr->super_Interaction).pi;
  pPVar43 = &(intr->super_Interaction).pi;
  uVar38 = (pPVar42->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  uVar39 = (pPVar42->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  afStack_134[0] = (float)uVar39;
  local_138 = (undefined1  [4])uVar38;
  uVar40 = (pPVar43->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  uVar41 = (pPVar43->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  afStack_134[2] = (float)uVar41;
  afStack_134[1] = (float)uVar40;
  _IStack_128 = auVar75._16_48_;
  auVar75 = _local_138;
  uVar7 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar14 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uStack_120._4_4_ = uVar14;
  uStack_120._0_4_ = uVar7;
  _local_138 = auVar75._0_24_;
  fStack_118 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar8 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar15 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auStack_114._4_4_ = uVar15;
  auStack_114._0_4_ = uVar8;
  auStack_108 = auVar79._48_16_;
  fStack_10c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_368._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_330 = lambda;
  local_2d8 = this;
  FVar64 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)local_258,local_368,(ulong)local_368._0_8_ >> 0x30);
  uVar11 = (lightSampler->
           super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
           ).bits;
  pEVar52 = (ExhaustiveLightSampler *)(uVar11 & 0xffffffffffff);
  sVar21 = (short)(uVar11 >> 0x30);
  local_1f8 = lightSampler;
  if (uVar11 >> 0x30 < 3) {
    if (sVar21 == 2) {
      PowerLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_308,(PowerLightSampler *)pEVar52,FVar64);
    }
    else {
      sVar13 = (pEVar52->lights).nStored;
      if (sVar13 == 0) {
        local_308._0_12_ = ZEXT412(0);
        local_308._12_4_ = 0;
        local_2f8._0_1_ = false;
        local_2f8._1_7_ = 0;
      }
      else {
        auVar58 = vcvtusi2ss_avx512f(auVar58,sVar13);
        iVar49 = (int)(FVar64 * auVar58._0_4_);
        iVar48 = (int)sVar13 + -1;
        if (iVar49 <= iVar48) {
          iVar48 = iVar49;
        }
        local_2f8._0_1_ = true;
        local_308._8_4_ = 1.0 / auVar58._0_4_;
        local_308._0_8_ =
             (pEVar52->lights).ptr[iVar48].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
    }
  }
  else if (sVar21 == 3) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_308,(BVHLightSampler *)pEVar52,
               (LightSampleContext *)local_138,FVar64);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_308,pEVar52,(LightSampleContext *)local_138,
               FVar64);
  }
  uVar11 = (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  sVar21 = (short)(uVar11 >> 0x30);
  if (uVar11 >> 0x30 < 5) {
    pHVar53 = (HaltonSampler *)(uVar11 & 0xffffffffffff);
    if (uVar11 < 0x3000000000000) {
      if (sVar21 == 2) {
        auVar72._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar53);
        auVar72._8_56_ = extraout_var_03;
        auVar58 = auVar72._0_16_;
      }
      else {
        auVar76._0_8_ = HaltonSampler::Get2D(pHVar53);
        auVar76._8_56_ = extraout_var_07;
        auVar58 = auVar76._0_16_;
      }
    }
    else if (sVar21 == 3) {
      auVar74._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar53);
      auVar74._8_56_ = extraout_var_05;
      auVar58 = auVar74._0_16_;
    }
    else {
      auVar78._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar53);
      auVar78._8_56_ = extraout_var_09;
      auVar58 = auVar78._0_16_;
    }
  }
  else {
    pDVar54 = (DebugMLTSampler *)(uVar11 & 0xffffffffffff);
    if (uVar11 < 0x7000000000000) {
      if (sVar21 == 6) {
        auVar73._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar54);
        auVar73._8_56_ = extraout_var_04;
        auVar58 = auVar73._0_16_;
      }
      else {
        auVar77._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar54);
        auVar77._8_56_ = extraout_var_08;
        auVar58 = auVar77._0_16_;
      }
    }
    else if (sVar21 == 7) {
      auVar75._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar54);
      auVar75._8_56_ = extraout_var_06;
      auVar58 = auVar75._0_16_;
    }
    else {
      local_398._0_4_ = DebugMLTSampler::Get1D(pDVar54);
      local_398._4_4_ = extraout_XMM0_Db;
      fStack_390 = (float)extraout_XMM0_Dc;
      fStack_38c = (float)extraout_XMM0_Dd;
      auVar79._0_4_ = DebugMLTSampler::Get1D(pDVar54);
      auVar79._4_60_ = extraout_var;
      auVar58 = vinsertps_avx(_local_398,auVar79._0_16_,0x10);
    }
  }
  local_320 = &(intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>;
  paVar2 = &intr->shading;
  _local_398 = ZEXT816(0);
  local_328 = bsdf;
  if (local_2f8._0_1_ == true) {
    uVar44 = local_308._0_8_;
    IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    local_368._0_8_ =
         (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    unique0x10001ac1 =
         (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    lStack_350._0_4_ = (((Normal3f *)local_320)->super_Tuple3<pbrt::Normal3,_float>).x;
    lStack_350._4_4_ = (((Normal3f *)local_320)->super_Tuple3<pbrt::Normal3,_float>).y;
    fStack_348 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_144._0_4_ = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.x;
    local_144._4_4_ = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.y;
    local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_198.low = (local_330->lambda).values[0];
    local_198.high = (local_330->lambda).values[1];
    uVar22 = *(undefined8 *)((local_330->lambda).values + 2);
    uVar23 = *(undefined8 *)(local_330->pdf).values;
    uVar24 = *(undefined8 *)((local_330->pdf).values + 2);
    local_258._16_8_ = &local_198;
    fStack_190 = (float)uVar22;
    fStack_18c = (float)((ulong)uVar22 >> 0x20);
    fStack_188 = (float)uVar23;
    fStack_184 = (float)((ulong)uVar23 >> 0x20);
    FStack_180 = (Float)uVar24;
    uStack_17c = (undefined4)((ulong)uVar24 >> 0x20);
    local_258._8_8_ = &local_2b0;
    local_2b0 = (Vector3f *)vmovlps_avx(auVar58);
    local_258._24_8_ = local_2c8;
    auVar58._12_4_ = 0;
    auVar58._0_12_ = _auStack_2c4;
    _local_2c8 = auVar58 << 0x20;
    local_298 = (anon_struct_8_0_00000001_for___align)local_308._0_8_;
    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
    uStack_344 = (undefined4)local_144;
    uStack_340 = local_144._4_4_;
    local_258._0_8_ = local_368;
    local_168 = (Interval<float>)local_368._0_8_;
    IStack_160 = unique0x10001ac1;
    IStack_158 = IStack_358;
    uStack_150 = lStack_350;
    local_148 = fStack_348;
    local_13c = local_33c;
    detail::DispatchSplit<9>::operator()(local_138);
    auVar79 = _local_138;
    auVar96 = stack0xfffffffffffffed0;
    _local_398 = ZEXT816(0);
    bVar47 = 0.0 < (float)uStack_120._4_4_;
    unique0x100042cb = auVar96;
    if (bVar47) {
      if (((float)local_138 == 0.0) && (!NAN((float)local_138))) {
        uVar11 = 0;
        while (uVar50 = uVar11, uVar50 != 3) {
          if ((*(float *)(local_138 + uVar50 * 4 + 4) != 0.0) ||
             (uVar11 = uVar50 + 1, NAN(*(float *)(local_138 + uVar50 * 4 + 4)))) break;
        }
        if (2 < uVar50) goto LAB_0040b58f;
      }
      pVVar1 = &(intr->super_Interaction).wo;
      uVar3 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar5 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_2b8 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      IVar46 = IStack_128;
      uVar97 = (undefined4)uStack_120;
      wiRender_01 = _IStack_128;
      uStack_1a0 = 0;
      uStack_19c = 0;
      _fStack_370 = 0;
      IStack_128.low = IVar46.low;
      IStack_128.high = IVar46.high;
      local_378._0_4_ = IStack_128.low;
      local_378._4_4_ = IStack_128.high;
      local_2e8._0_4_ = uVar97;
      auVar106 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar96 = ZEXT856(0);
      local_1a8 = (Float)uVar3;
      uStack_1a4 = uVar5;
      _local_138 = auVar79;
      SVar107 = BSDF::f(local_328,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3f)wiRender_01,Radiance);
      auVar79 = _local_138;
      auVar101._0_8_ = SVar107.values.values._8_8_;
      auVar101._8_56_ = auVar106;
      auVar80._0_8_ = SVar107.values.values._0_8_;
      auVar80._8_56_ = auVar96;
      fVar66 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar58 = vmovlhps_avx(auVar80._0_16_,auVar101._0_16_);
      auVar57 = vmovshdup_avx(_local_378);
      in_ZMM5 = ZEXT464((uint)local_2e8._0_4_);
      auVar98 = ZEXT416((uint)((float)local_2e8._0_4_ * fVar66));
      auVar57 = vfmadd132ss_fma(auVar57,auVar98,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar98 = vfmsub213ss_fma(ZEXT416((uint)fVar66),ZEXT416((uint)local_2e8._0_4_),auVar98);
      auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ + auVar98._0_4_)),_local_378,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar98._0_4_ = auVar57._0_4_;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx512vl(auVar98,auVar57);
      local_368._0_4_ = auVar57._0_4_ * auVar58._0_4_;
      local_368._4_4_ = auVar57._4_4_ * auVar58._4_4_;
      fStack_35c = auVar57._12_4_ * auVar58._12_4_;
      local_368._8_4_ = auVar57._8_4_ * auVar58._8_4_;
      if (((float)local_368._0_4_ == 0.0) && (!NAN((float)local_368._0_4_))) {
        uVar11 = 0;
        while (uVar50 = uVar11, uVar50 != 3) {
          if ((*(float *)(local_368 + uVar50 * 4 + 4) != 0.0) ||
             (uVar11 = uVar50 + 1, NAN(*(float *)(local_368 + uVar50 * 4 + 4)))) break;
        }
        _local_398 = ZEXT416(0) << 0x20;
        if (2 < uVar50) goto LAB_0040b58f;
      }
      local_268 = (Interval<float>)_local_138;
      IStack_260.low = afStack_134[1];
      IStack_260.high = afStack_134[2];
      _local_138 = auVar79;
      bVar47 = Integrator::Unoccluded
                         (&local_2d8->super_Integrator,&intr->super_Interaction,
                          (Interaction *)(auStack_114 + 4));
      pBVar56 = local_328;
      auVar58 = _local_378;
      auVar96 = stack0xfffffffffffffed0;
      _local_398 = ZEXT816(0);
      if (bVar47) {
        if (local_2f8._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
        }
        fVar66 = (float)local_308._8_4_ * (float)uStack_120._4_4_;
        if (*(uint *)(uVar44 & 0xffffffffffff) < 2) {
          auVar67._0_4_ = local_268.low * (float)local_368._0_4_;
          auVar67._4_4_ = local_268.high * (float)local_368._4_4_;
          auVar67._8_4_ = IStack_260.low * (float)local_368._8_4_;
          auVar67._12_4_ = IStack_260.high * fStack_35c;
          unique0x1000433b = auVar96;
        }
        else {
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_1a4;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_1a8;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2b8;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2e8._0_4_;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_378._0_4_;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_378._4_4_;
          _local_378 = auVar58;
          FVar64 = BSDF::PDF(local_328,woRender,wiRender_02,Radiance,All);
          local_378._0_4_ = FVar64;
          if (SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
              ::reg == '\0') {
            iVar48 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                          ::reg);
            if (iVar48 != 0) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                          ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                ::StatsAccumulator__,(PixelAccumFunc)0x0);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                   ::reg);
              pBVar56 = local_328;
            }
          }
          *(long *)(in_FS_OFFSET + -600) = *(long *)(in_FS_OFFSET + -600) + 1;
          if ((((float)local_378._0_4_ == 0.0) && (!NAN((float)local_378._0_4_))) &&
             (1 < *(ushort *)
                   ((long)&(pBVar56->bxdf).
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits + 6) - 3)) {
            *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
          }
          auVar58 = vfmadd231ss_fma(ZEXT416((uint)((float)local_378._0_4_ * (float)local_378._0_4_))
                                    ,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
          fVar65 = (fVar66 * fVar66) / auVar58._0_4_;
          auVar67._0_4_ = fVar65 * local_268.low * (float)local_368._0_4_;
          auVar67._4_4_ = fVar65 * local_268.high * (float)local_368._4_4_;
          auVar67._8_4_ = fVar65 * IStack_260.low * (float)local_368._8_4_;
          auVar67._12_4_ = fVar65 * IStack_260.high * fStack_35c;
        }
        auVar99._4_4_ = fVar66;
        auVar99._0_4_ = fVar66;
        auVar99._8_4_ = fVar66;
        auVar99._12_4_ = fVar66;
        auVar58 = vdivps_avx(auVar67,auVar99);
        auVar57 = vshufpd_avx(auVar58,auVar58,1);
        _local_398 = vunpcklpd_avx(auVar58,auVar57);
      }
    }
  }
LAB_0040b58f:
  pBVar56 = local_328;
  _local_138 = (sampler->
               super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
  FVar64 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)local_368,local_138,(ulong)_local_138 >> 0x30);
  pSVar45 = local_2d8;
  local_378._0_4_ = FVar64;
  uVar4 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar6 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  local_2e8._4_4_ = uVar6;
  local_2e8._0_4_ = uVar4;
  local_2e8._8_8_ = 0;
  local_268.low = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar11 = (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  sVar21 = (short)(uVar11 >> 0x30);
  if (uVar11 < 0x5000000000000) {
    pHVar53 = (HaltonSampler *)(uVar11 & 0xffffffffffff);
    if (uVar11 < 0x3000000000000) {
      if (sVar21 == 2) {
        auVar81._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar53);
        auVar81._8_56_ = extraout_var_10;
        auVar58 = auVar81._0_16_;
      }
      else {
        auVar85._0_8_ = HaltonSampler::Get2D(pHVar53);
        auVar85._8_56_ = extraout_var_14;
        auVar58 = auVar85._0_16_;
      }
    }
    else if (sVar21 == 3) {
      auVar83._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar53);
      auVar83._8_56_ = extraout_var_12;
      auVar58 = auVar83._0_16_;
    }
    else {
      auVar87._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar53);
      auVar87._8_56_ = extraout_var_16;
      auVar58 = auVar87._0_16_;
    }
  }
  else {
    pDVar54 = (DebugMLTSampler *)(uVar11 & 0xffffffffffff);
    if (uVar11 < 0x7000000000000) {
      if (sVar21 == 6) {
        auVar82._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar54);
        auVar82._8_56_ = extraout_var_11;
        auVar58 = auVar82._0_16_;
      }
      else {
        auVar86._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar54);
        auVar86._8_56_ = extraout_var_15;
        auVar58 = auVar86._0_16_;
      }
    }
    else if (sVar21 == 7) {
      auVar84._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar54);
      auVar84._8_56_ = extraout_var_13;
      auVar58 = auVar84._0_16_;
    }
    else {
      local_1a8 = DebugMLTSampler::Get1D(pDVar54);
      uStack_1a4 = extraout_XMM0_Db_00;
      uStack_1a0 = extraout_XMM0_Dc_00;
      uStack_19c = extraout_XMM0_Dd_00;
      auVar88._0_4_ = DebugMLTSampler::Get1D(pDVar54);
      auVar88._4_60_ = extraout_var_00;
      auVar37._4_4_ = uStack_1a4;
      auVar37._0_4_ = local_1a8;
      auVar37._8_4_ = uStack_1a0;
      auVar37._12_4_ = uStack_19c;
      auVar58 = vinsertps_avx(auVar37,auVar88._0_16_,0x10);
    }
  }
  auVar57 = local_2e8;
  _local_138 = vmovlps_avx(auVar58);
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_268.low;
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2e8._0_4_;
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2e8._4_4_;
  local_2e8 = auVar57;
  BSDF::Sample_f((BSDFSample *)&local_298,pBVar56,woRender_00,(Float)local_378._0_4_,
                 (Point2f *)local_138,Radiance,All);
  if (0.0 < local_27c) {
    if (((float)local_298 == 0.0) && (!NAN((float)local_298))) {
      uVar11 = 0;
      while (uVar50 = uVar11, uVar50 != 3) {
        fVar66 = *(float *)((long)&local_298 + uVar50 * 4 + 4);
        if ((fVar66 != 0.0) || (uVar11 = uVar50 + 1, NAN(fVar66))) break;
      }
      if (2 < uVar50) goto LAB_0040c139;
    }
    local_318.super_Tuple3<pbrt::Vector3,_float>.z = local_280;
    local_318.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_288;
    local_318.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(local_288,4);
    fVar66 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar57 = ZEXT416((uint)(fVar66 * local_280));
    auVar58 = vfmadd132ss_fma(ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y),
                              auVar57,ZEXT416((uint)local_318.super_Tuple3<pbrt::Vector3,_float>.y))
    ;
    auVar57 = vfmsub213ss_fma(ZEXT416((uint)local_280),ZEXT416((uint)fVar66),auVar57);
    auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ + auVar57._0_4_)),
                              ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x),
                              ZEXT416((uint)local_318.super_Tuple3<pbrt::Vector3,_float>.x));
    uVar97 = auVar58._0_4_;
    auVar68._4_4_ = uVar97;
    auVar68._0_4_ = uVar97;
    auVar68._8_4_ = uVar97;
    auVar68._12_4_ = uVar97;
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar89._0_16_ = vandps_avx512vl(auVar68,auVar18);
    auVar89._16_48_ = auVar63;
    fStack_2d0 = auVar89._8_4_ * fStack_290;
    fStack_2cc = auVar89._12_4_ * fStack_28c;
    local_2d8 = (SPPMIntegrator *)
                CONCAT44(auVar89._4_4_ * local_298._4_4_,auVar89._0_4_ * (float)local_298);
    Interaction::SpawnRay((RayDifferential *)local_138,&intr->super_Interaction,&local_318);
    fStack_188 = local_138._16_4_;
    fStack_184 = local_138._20_4_;
    FStack_180 = local_138._24_4_;
    local_198 = (Interval<float>)_local_138;
    fStack_190 = local_138._8_4_;
    fStack_18c = local_138._12_4_;
    local_178.bits = _fStack_118;
    *(long *)(in_FS_OFFSET + -0x2d8) = *(long *)(in_FS_OFFSET + -0x2d8) + 1;
    if (((pSVar45->super_Integrator).aggregate.
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         .bits & 0xffffffffffff) == 0) {
      auVar89 = ZEXT864(0) << 0x20;
      local_38._0_1_ = false;
      local_38._1_7_ = 0;
      _local_138 = auVar89;
      local_f8 = auVar89;
      local_b8 = auVar89;
      local_78 = auVar89;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)local_138,
                 &(pSVar45->super_Integrator).aggregate,(Ray *)&local_198,INFINITY);
    }
    auVar63 = auVar89._16_48_;
    if (local_38._0_1_ == true) {
      auVar69._0_8_ = CONCAT44(fStack_188,fStack_18c) ^ 0x8000000080000000;
      auVar69._8_4_ = 0x80000000;
      auVar69._12_4_ = 0x80000000;
      auVar100._8_4_ = 0x80000000;
      auVar100._0_8_ = 0x8000000000000000;
      auVar100._12_4_ = 0x80000000;
      local_368._0_8_ = vmovlps_avx(auVar69);
      stack0xfffffffffffffca0 = (Interval<float>)(CONCAT44(fStack_35c,fStack_184) ^ 0x80000000);
      auVar96 = ZEXT856(auVar69._8_8_);
      auVar106 = ZEXT856(auVar100._8_8_);
      auVar58 = in_ZMM5._0_16_;
      SVar107 = SurfaceInteraction::Le
                          ((SurfaceInteraction *)local_138,(Vector3f *)local_368,local_330);
      auVar79 = local_78;
      auVar102._0_8_ = SVar107.values.values._8_8_;
      auVar102._8_56_ = auVar106;
      auVar90._0_8_ = SVar107.values.values._0_8_;
      auVar90._8_56_ = auVar96;
      _local_2c8 = vmovlhps_avx(auVar90._0_16_,auVar102._0_16_);
      if (((float)local_2c8 == 0.0) && (!NAN((float)local_2c8))) {
        uVar11 = 0;
        while (uVar50 = uVar11, uVar50 != 3) {
          if ((*(float *)(local_2c8 + uVar50 * 4 + 4) != 0.0) ||
             (uVar11 = uVar50 + 1, NAN(*(float *)(local_2c8 + uVar50 * 4 + 4)))) break;
        }
        if (2 < uVar50) goto LAB_0040c139;
      }
      if ((local_278 & Specular) == Unset) {
        if (local_38._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
        }
        uVar22 = local_78._8_8_;
        local_258._16_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
        local_258._0_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
        local_258._8_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
        local_238 = local_320->z;
        local_258._24_4_ = local_320->x;
        local_258._28_4_ = local_320->y;
        local_234.z = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_234.x = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.x;
        local_234.y = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.y;
        uVar11 = (local_1f8->
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 ).bits;
        pEVar52 = (ExhaustiveLightSampler *)(uVar11 & 0xffffffffffff);
        sVar21 = (short)(uVar11 >> 0x30);
        if (uVar11 < 0x3000000000000) {
          if (sVar21 == 2) {
            local_368._0_8_ = local_78._8_8_;
            local_378._0_4_ =
                 PowerLightSampler::PDF
                           ((PowerLightSampler *)pEVar52,(LightSampleContext *)local_258,
                            (LightHandle *)local_368);
            local_378._4_4_ = extraout_XMM0_Db_01;
            fStack_370 = (float)extraout_XMM0_Dc_01;
            fStack_36c = (float)extraout_XMM0_Dd_01;
          }
          else {
            sVar13 = (pEVar52->lights).nStored;
            auVar58 = vcvtusi2ss_avx512f(auVar58,sVar13);
            fVar66 = 1.0 / auVar58._0_4_;
            auVar62._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar62._0_4_ = fVar66;
            auVar62._16_48_ = auVar63;
            auVar61._4_60_ = auVar62._4_60_;
            auVar61._0_4_ = (uint)(sVar13 != 0) * (int)fVar66;
            _local_378 = auVar61._0_16_;
          }
        }
        else if (sVar21 == 3) {
          local_368._0_8_ = local_78._8_8_;
          local_378._0_4_ =
               BVHLightSampler::PDF
                         ((BVHLightSampler *)pEVar52,(LightSampleContext *)local_258,
                          (LightHandle *)local_368);
          local_378._4_4_ = extraout_XMM0_Db_05;
          fStack_370 = (float)extraout_XMM0_Dc_05;
          fStack_36c = (float)extraout_XMM0_Dd_05;
        }
        else {
          local_368._0_8_ = local_78._8_8_;
          local_378._0_4_ =
               ExhaustiveLightSampler::PDF
                         (pEVar52,(LightSampleContext *)local_258,(LightHandle *)local_368);
          local_378._4_4_ = extraout_XMM0_Db_06;
          fStack_370 = (float)extraout_XMM0_Dc_06;
          fStack_36c = (float)extraout_XMM0_Dd_06;
        }
        IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
        local_368._0_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
        unique0x10001be1 =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
        fStack_348 = local_320->z;
        lStack_350._0_4_ = local_320->x;
        lStack_350._4_4_ = local_320->y;
        local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
        uVar10 = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.x;
        uVar17 = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.y;
        local_1e8 = CONCAT44(local_318.super_Tuple3<pbrt::Vector3,_float>.y,
                             local_318.super_Tuple3<pbrt::Vector3,_float>.x);
        VVar32.super_Tuple3<pbrt::Vector3,_float>.y = local_318.super_Tuple3<pbrt::Vector3,_float>.y
        ;
        VVar32.super_Tuple3<pbrt::Vector3,_float>.x = local_318.super_Tuple3<pbrt::Vector3,_float>.x
        ;
        VVar32.super_Tuple3<pbrt::Vector3,_float>.z = local_318.super_Tuple3<pbrt::Vector3,_float>.z
        ;
        VVar31.super_Tuple3<pbrt::Vector3,_float>.y = local_318.super_Tuple3<pbrt::Vector3,_float>.y
        ;
        VVar31.super_Tuple3<pbrt::Vector3,_float>.x = local_318.super_Tuple3<pbrt::Vector3,_float>.x
        ;
        VVar31.super_Tuple3<pbrt::Vector3,_float>.z = local_318.super_Tuple3<pbrt::Vector3,_float>.z
        ;
        puStack_2a8 = &local_1e8;
        local_1e0 = local_318.super_Tuple3<pbrt::Vector3,_float>.z;
        local_2a0 = (ulong *)&local_2b4;
        local_2b4 = 0;
        uStack_344 = uVar10;
        uStack_340 = uVar17;
        local_2b0 = (Vector3f *)local_368;
        local_228 = (Interval<float>)local_368._0_8_;
        IStack_220 = unique0x10001be1;
        IStack_218 = IStack_358;
        lStack_210 = lStack_350;
        local_208 = fStack_348;
        local_204 = uVar10;
        uStack_200 = uVar17;
        local_1fc = local_33c;
        if ((ulong)uVar22 < 0x5000000000000) {
          fVar66 = 0.0;
          if (0x2ffffffffffff < (ulong)uVar22) {
            if (auVar79._14_2_ == 3) {
              LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar10;
              LVar27.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_348;
              LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.z = local_33c;
              LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar17;
              LVar27.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)lStack_350;
              LVar27.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)lStack_350._4_4_;
              LVar27.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                   (Point3<pbrt::Interval<float>_>)
                   (Point3<pbrt::Interval<float>_>)
                   (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
              fVar66 = ProjectionLight::PDF_Li
                                 ((ProjectionLight *)(uVar22 & 0xffffffffffff),LVar27,VVar31,WithMIS
                                 );
            }
            else {
              LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar10;
              LVar28.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_348;
              LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.z = local_33c;
              LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar17;
              LVar28.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)lStack_350;
              LVar28.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)lStack_350._4_4_;
              LVar28.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                   (Point3<pbrt::Interval<float>_>)
                   (Point3<pbrt::Interval<float>_>)
                   (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
              fVar66 = GoniometricLight::PDF_Li
                                 ((GoniometricLight *)(uVar22 & 0xffffffffffff),LVar28,VVar32,
                                  WithMIS);
            }
          }
        }
        else {
          local_1f0 = uVar22;
          fVar66 = detail::DispatchSplit<5>::operator()(&local_379,&local_1f0,auVar79._14_2_ - 4);
        }
        if (*(ushort *)
             ((long)&(pBVar56->bxdf).
                     super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     .bits + 6) - 3 < 2) {
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
               local_318.super_Tuple3<pbrt::Vector3,_float>.y;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
               local_318.super_Tuple3<pbrt::Vector3,_float>.x;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
               local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar95._0_4_ =
               BSDF::PDF(pBVar56,(Vector3f)
                                 (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>,
                         wiRender_00,Radiance,All);
          auVar95._4_60_ = extraout_var_02;
          auVar58 = auVar95._0_16_;
        }
        else {
          auVar58 = ZEXT416((uint)local_27c);
        }
        auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar66 * (float)local_378._0_4_ *
                                                fVar66 * (float)local_378._0_4_)),auVar58,auVar58);
        fVar66 = (auVar58._0_4_ * auVar58._0_4_) / auVar57._0_4_;
        auVar71._0_4_ = fVar66 * (float)local_2d8 * (float)local_2c8;
        auVar71._4_4_ = fVar66 * local_2d8._4_4_ * (float)auStack_2c4._0_4_;
        auVar71._8_4_ = fVar66 * fStack_2d0 * (float)auStack_2c4._4_4_;
        auVar71._12_4_ = fVar66 * fStack_2cc * fStack_2bc;
      }
      else {
        auVar71._0_4_ = (float)local_2d8 * (float)local_2c8;
        auVar71._4_4_ = local_2d8._4_4_ * (float)auStack_2c4._0_4_;
        auVar71._8_4_ = fStack_2d0 * (float)auStack_2c4._4_4_;
        auVar71._12_4_ = fStack_2cc * fStack_2bc;
      }
      auVar19._4_4_ = local_27c;
      auVar19._0_4_ = local_27c;
      auVar19._8_4_ = local_27c;
      auVar19._12_4_ = local_27c;
      auVar58 = vdivps_avx512vl(auVar71,auVar19);
      local_398._4_4_ = auVar58._4_4_ + (float)local_398._4_4_;
      local_398._0_4_ = auVar58._0_4_ + (float)local_398._0_4_;
      fStack_390 = auVar58._8_4_ + fStack_390;
      fStack_38c = auVar58._12_4_ + fStack_38c;
    }
    else {
      pLVar12 = (pSVar45->super_Integrator).infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pLVar55 = (pSVar45->super_Integrator).infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start; pLVar55 != pLVar12;
          pLVar55 = pLVar55 + 1) {
        auVar63 = auVar89._16_48_;
        uVar11 = (pLVar55->
                 super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 ).bits;
        auVar58 = ZEXT816(0) << 0x40;
        auVar57 = ZEXT816(0) << 0x40;
        if (0x6ffffffffffff < uVar11) {
          this_00 = (ImageInfiniteLight *)(uVar11 & 0xffffffffffff);
          auVar58 = in_ZMM5._0_16_;
          if (uVar11 >> 0x30 == 8) {
            auVar96 = ZEXT856(0);
            auVar106 = ZEXT856(0);
            in_ZMM5 = ZEXT1664(auVar58);
            SVar107 = ImageInfiniteLight::Le(this_00,(Ray *)&local_198,local_330);
            auVar104._0_8_ = SVar107.values.values._8_8_;
            auVar104._8_56_ = auVar106;
            auVar57 = auVar104._0_16_;
            auVar92._0_8_ = SVar107.values.values._0_8_;
            auVar92._8_56_ = auVar96;
            auVar58 = auVar92._0_16_;
          }
          else if ((short)(uVar11 >> 0x30) == 7) {
            auVar96 = ZEXT856(0);
            auVar106 = ZEXT856(0);
            in_ZMM5 = ZEXT1664(auVar58);
            SVar107 = UniformInfiniteLight::Le
                                ((UniformInfiniteLight *)this_00,(Ray *)&local_198,local_330);
            auVar103._0_8_ = SVar107.values.values._8_8_;
            auVar103._8_56_ = auVar106;
            auVar57 = auVar103._0_16_;
            auVar91._0_8_ = SVar107.values.values._0_8_;
            auVar91._8_56_ = auVar96;
            auVar58 = auVar91._0_16_;
          }
          else {
            auVar96 = ZEXT856(0);
            auVar106 = ZEXT856(0);
            in_ZMM5 = ZEXT1664(auVar58);
            SVar107 = PortalImageInfiniteLight::Le
                                ((PortalImageInfiniteLight *)this_00,(Ray *)&local_198,local_330);
            auVar105._0_8_ = SVar107.values.values._8_8_;
            auVar105._8_56_ = auVar106;
            auVar57 = auVar105._0_16_;
            auVar93._0_8_ = SVar107.values.values._0_8_;
            auVar93._8_56_ = auVar96;
            auVar58 = auVar93._0_16_;
          }
        }
        auVar58 = vmovlhps_avx(auVar58,auVar57);
        if ((local_278 & Specular) == Unset) {
          local_258._16_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_258._0_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          local_258._8_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_238 = local_320->z;
          local_258._24_8_ = *(undefined8 *)local_320;
          local_234.z = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_234.x = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.x;
          local_234.y = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.y;
          local_368._0_8_ =
               (pLVar55->
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               ).bits;
          uVar11 = (local_1f8->
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   ).bits;
          pEVar52 = (ExhaustiveLightSampler *)(uVar11 & 0xffffffffffff);
          sVar21 = (short)(uVar11 >> 0x30);
          auVar57 = in_ZMM5._0_16_;
          _local_378 = auVar58;
          if (uVar11 < 0x3000000000000) {
            if (sVar21 == 2) {
              in_ZMM5 = ZEXT1664(auVar57);
              local_2e8._0_4_ =
                   PowerLightSampler::PDF
                             ((PowerLightSampler *)pEVar52,(LightSampleContext *)local_258,
                              (LightHandle *)local_368);
              local_2e8._4_4_ = extraout_XMM0_Db_02;
              local_2e8._8_4_ = extraout_XMM0_Dc_02;
              local_2e8._12_4_ = extraout_XMM0_Dd_02;
            }
            else {
              sVar13 = (pEVar52->lights).nStored;
              auVar58 = vcvtusi2ss_avx512f(auVar57,sVar13);
              fVar66 = 1.0 / auVar58._0_4_;
              auVar60._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar60._0_4_ = fVar66;
              auVar60._16_48_ = auVar63;
              auVar59._4_60_ = auVar60._4_60_;
              auVar59._0_4_ = (uint)(sVar13 != 0) * (int)fVar66;
              local_2e8 = auVar59._0_16_;
            }
          }
          else if (sVar21 == 3) {
            in_ZMM5 = ZEXT1664(auVar57);
            local_2e8._0_4_ =
                 BVHLightSampler::PDF
                           ((BVHLightSampler *)pEVar52,(LightSampleContext *)local_258,
                            (LightHandle *)local_368);
            local_2e8._4_4_ = extraout_XMM0_Db_03;
            local_2e8._8_4_ = extraout_XMM0_Dc_03;
            local_2e8._12_4_ = extraout_XMM0_Dd_03;
          }
          else {
            in_ZMM5 = ZEXT1664(auVar57);
            local_2e8._0_4_ =
                 ExhaustiveLightSampler::PDF
                           (pEVar52,(LightSampleContext *)local_258,(LightHandle *)local_368);
            local_2e8._4_4_ = extraout_XMM0_Db_04;
            local_2e8._8_4_ = extraout_XMM0_Dc_04;
            local_2e8._12_4_ = extraout_XMM0_Dd_04;
          }
          IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_368._0_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          unique0x10001b81 =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          fStack_1b8 = local_320->z;
          lStack_1c0._0_4_ = local_320->x;
          lStack_1c0._4_4_ = local_320->y;
          local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar9 = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.x;
          uVar16 = (paVar2->n).super_Tuple3<pbrt::Normal3,_float>.y;
          auStack_2c4._0_4_ = local_318.super_Tuple3<pbrt::Vector3,_float>.y;
          local_2c8 = (undefined1  [4])local_318.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar30.super_Tuple3<pbrt::Vector3,_float>.y =
               local_318.super_Tuple3<pbrt::Vector3,_float>.y;
          VVar30.super_Tuple3<pbrt::Vector3,_float>.x =
               local_318.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar30.super_Tuple3<pbrt::Vector3,_float>.z =
               local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          VVar29.super_Tuple3<pbrt::Vector3,_float>.y =
               local_318.super_Tuple3<pbrt::Vector3,_float>.y;
          VVar29.super_Tuple3<pbrt::Vector3,_float>.x =
               local_318.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar29.super_Tuple3<pbrt::Vector3,_float>.z =
               local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          lStack_350 = SUB128(*local_320,0);
          fStack_348 = (*local_320).z;
          uStack_344 = uVar9;
          uStack_340 = uVar16;
          auStack_2c4._4_4_ = local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          local_1f0 = local_1f0 & 0xffffffff00000000;
          local_2b0 = (Vector3f *)local_368;
          puStack_2a8 = (ulong *)local_2c8;
          local_2a0 = &local_1f0;
          uVar11 = (pLVar55->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          uVar51 = (uint)(ushort)(uVar11 >> 0x30);
          auVar58 = in_ZMM5._0_16_;
          local_1d8 = (Interval<float>)local_368._0_8_;
          IStack_1d0 = unique0x10001b81;
          IStack_1c8 = IStack_358;
          uStack_1b4 = uVar9;
          uStack_1b0 = uVar16;
          fStack_1ac = local_33c;
          if (uVar11 < 0x5000000000000) {
            FVar64 = 0.0;
            if (0x2ffffffffffff < uVar11) {
              if (uVar51 == 3) {
                auVar34._8_8_ = lStack_1c0;
                auVar34._0_4_ = IStack_358.low;
                auVar34._4_4_ = IStack_358.high;
                auVar34._16_4_ = fStack_1b8;
                auVar34._20_4_ = uVar9;
                auVar33._24_4_ = uVar16;
                auVar33._0_24_ = auVar34;
                auVar33._28_4_ = local_33c;
                in_ZMM5 = ZEXT1664(auVar58);
                LVar25.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)lStack_1c0;
                LVar25.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)lStack_1c0._4_4_;
                LVar25.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                     (Point3<pbrt::Interval<float>_>)
                     (Point3<pbrt::Interval<float>_>)
                     (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
                LVar25.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar34._16_8_;
                LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                     (float)(int)((ulong)auVar34._16_8_ >> 0x20);
                LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar33._24_8_;
                LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                     (float)(int)((ulong)auVar33._24_8_ >> 0x20);
                FVar64 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(uVar11 & 0xffffffffffff),LVar25,VVar29,
                                    WithMIS);
              }
              else {
                auVar36._8_8_ = lStack_1c0;
                auVar36._0_4_ = IStack_358.low;
                auVar36._4_4_ = IStack_358.high;
                auVar36._16_4_ = fStack_1b8;
                auVar36._20_4_ = uVar9;
                auVar35._24_4_ = uVar16;
                auVar35._0_24_ = auVar36;
                auVar35._28_4_ = local_33c;
                in_ZMM5 = ZEXT1664(auVar58);
                LVar26.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)lStack_1c0;
                LVar26.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)lStack_1c0._4_4_;
                LVar26.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                     (Point3<pbrt::Interval<float>_>)
                     (Point3<pbrt::Interval<float>_>)
                     (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
                LVar26.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar36._16_8_;
                LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                     (float)(int)((ulong)auVar36._16_8_ >> 0x20);
                LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar35._24_8_;
                LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                     (float)(int)((ulong)auVar35._24_8_ >> 0x20);
                FVar64 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(uVar11 & 0xffffffffffff),LVar26,VVar30,
                                    WithMIS);
              }
            }
          }
          else {
            in_ZMM5 = ZEXT1664(auVar58);
            local_1e8 = uVar11;
            FVar64 = detail::DispatchSplit<5>::operator()
                               ((DispatchSplit<5> *)&local_2b4,&local_1e8,uVar51 - 4);
          }
          if (*(ushort *)
               ((long)&(local_328->bxdf).
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                       .bits + 6) - 3 < 2) {
            local_268.low = FVar64;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.y;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.x;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.z;
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            auVar94._0_4_ =
                 BSDF::PDF(local_328,
                           (Vector3f)(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>
                           ,wiRender,Radiance,All);
            auVar94._4_60_ = extraout_var_01;
            auVar58 = auVar94._0_16_;
            FVar64 = local_268.low;
          }
          else {
            auVar58 = ZEXT416((uint)local_27c);
          }
          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(FVar64 * (float)local_2e8._0_4_ *
                                                  FVar64 * (float)local_2e8._0_4_)),auVar58,auVar58)
          ;
          fVar66 = (auVar58._0_4_ * auVar58._0_4_) / auVar57._0_4_;
          auVar70._0_4_ = fVar66 * (float)local_378._0_4_ * (float)local_2d8;
          auVar70._4_4_ = fVar66 * (float)local_378._4_4_ * local_2d8._4_4_;
          auVar70._8_4_ = fVar66 * fStack_370 * fStack_2d0;
          auVar70._12_4_ = fVar66 * fStack_36c * fStack_2cc;
        }
        else {
          auVar70._0_4_ = auVar58._0_4_ * (float)local_2d8;
          auVar70._4_4_ = auVar58._4_4_ * local_2d8._4_4_;
          auVar70._8_4_ = auVar58._8_4_ * fStack_2d0;
          auVar70._12_4_ = auVar58._12_4_ * fStack_2cc;
        }
        auVar20._4_4_ = local_27c;
        auVar20._0_4_ = local_27c;
        auVar20._8_4_ = local_27c;
        auVar20._12_4_ = local_27c;
        auVar89._0_16_ = vdivps_avx512vl(auVar70,auVar20);
        auVar89._16_48_ = auVar63;
        local_398._4_4_ = auVar89._4_4_ + (float)local_398._4_4_;
        local_398._0_4_ = auVar89._0_4_ + (float)local_398._0_4_;
        fStack_390 = auVar89._8_4_ + fStack_390;
        fStack_38c = auVar89._12_4_ + fStack_38c;
      }
    }
  }
LAB_0040c139:
  auVar58 = vshufpd_avx(_local_398,_local_398,1);
  SVar107.values.values._0_8_ = local_398;
  SVar107.values.values._8_8_ = auVar58._0_8_;
  return (SampledSpectrum)SVar107.values.values;
}

Assistant:

SampledSpectrum SPPMIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         LightSamplerHandle lightSampler) const {
    // NOTE: share fragments from PathIntegrator::SampleLd here...
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());

    Point2f uLight = sampler.Get2D();

    SampledSpectrum Ld(0.f);

    if (sampledLight) {
        LightHandle light = sampledLight->light;
        DCHECK(light != nullptr && sampledLight->pdf > 0);

        // Sample light source with multiple importance sampling
        LightLiSample ls =
            light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
        if (ls && ls.L) {
            // Evaluate BSDF for light sampling strategy
            Vector3f wo = intr.wo, wi = ls.wi;
            SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
            if (f) {
                SampledSpectrum Li = ls.L;
                if (Unoccluded(intr, ls.pLight)) {
                    // Add light's contribution to reflected radiance
                    Float lightPDF = sampledLight->pdf * ls.pdf;
                    if (IsDeltaLight(light.Type()))
                        Ld = f * Li / lightPDF;
                    else {
                        Float bsdfPDF = bsdf.PDF(wo, wi);
                        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false &&
                                             bsdfPDF == 0);
                        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
                        Ld = f * Li * weight / lightPDF;
                    }
                }
            }
        }
    }

    Float uScattering = sampler.Get1D();
    BSDFSample bs = bsdf.Sample_f(intr.wo, uScattering, sampler.Get2D());
    if (!bs || !bs.f)
        return Ld;

    Vector3f wi = bs.wi;
    SampledSpectrum f = bs.f * AbsDot(wi, intr.shading.n);

    Ray ray = intr.SpawnRay(wi);
    pstd::optional<ShapeIntersection> si = Intersect(ray);
    if (si) {
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF = lightSampler.PDF(intr, areaLight) *
                                 areaLight.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    } else {
        for (const auto &light : infiniteLights) {
            SampledSpectrum Le = light.Le(ray, lambda);
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                Float lightPDF = lightSampler.PDF(intr, light) *
                                 light.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    }
    return Ld;
}